

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImPlotColormap ImPlot::AddColormap(char *name,ImVec4 *colormap,int size,bool qual)

{
  ImPlotColormap IVar1;
  ImU32 IVar2;
  int iVar3;
  uint *puVar4;
  int local_48;
  int i;
  undefined1 local_38 [8];
  ImVector<unsigned_int> buffer;
  ImPlotContext *gp;
  bool qual_local;
  int size_local;
  ImVec4 *colormap_local;
  char *name_local;
  
  buffer.Data = (uint *)GImPlot;
  if (size < 2) {
    __assert_fail("(size > 1) && \"The colormap size must be greater than 1!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xcf7,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImVec4 *, int, bool)");
  }
  IVar1 = ImPlotColormapData::GetIndex(&GImPlot->ColormapData,name);
  if (IVar1 != -1) {
    __assert_fail("(gp.ColormapData.GetIndex(name) == -1) && \"The colormap name has already been used!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xcf8,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImVec4 *, int, bool)");
  }
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)local_38);
  ImVector<unsigned_int>::resize((ImVector<unsigned_int> *)local_38,size);
  for (local_48 = 0; local_48 < size; local_48 = local_48 + 1) {
    IVar2 = ImGui::ColorConvertFloat4ToU32(colormap + local_48);
    puVar4 = ImVector<unsigned_int>::operator[]((ImVector<unsigned_int> *)local_38,local_48);
    *puVar4 = IVar2;
  }
  iVar3 = ImPlotColormapData::Append
                    ((ImPlotColormapData *)(buffer.Data + 300),name,(ImU32 *)buffer._0_8_,size,qual)
  ;
  ImVector<unsigned_int>::~ImVector((ImVector<unsigned_int> *)local_38);
  return iVar3;
}

Assistant:

ImPlotColormap AddColormap(const char* name, const ImVec4* colormap, int size, bool qual) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(size > 1, "The colormap size must be greater than 1!");
    IM_ASSERT_USER_ERROR(gp.ColormapData.GetIndex(name) == -1, "The colormap name has already been used!");
    ImVector<ImU32> buffer;
    buffer.resize(size);
    for (int i = 0; i < size; ++i)
        buffer[i] = ImGui::ColorConvertFloat4ToU32(colormap[i]);
    return gp.ColormapData.Append(name, buffer.Data, size, qual);
}